

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldDataPdu.cpp
# Opt level: O0

void __thiscall DIS::MinefieldDataPdu::marshal(MinefieldDataPdu *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  const_reference pvVar4;
  undefined1 local_60 [8];
  Vector3Float x_1;
  size_t idx_1;
  undefined1 local_30 [8];
  TwoByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  MinefieldDataPdu *this_local;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_minefieldSequenceNumbeer);
  DataStream::operator<<(dataStream,this->_requestID);
  DataStream::operator<<(dataStream,this->_pduSequenceNumber);
  DataStream::operator<<(dataStream,this->_numberOfPdus);
  sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                    (&this->_mineLocation);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  sVar2 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::size
                    (&this->_sensorTypes);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_pad2);
  DataStream::operator<<(dataStream,this->_dataFilter);
  EntityType::marshal(&this->_mineType,dataStream);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._10_6_ = 0;
  while( true ) {
    uVar1 = x._8_8_;
    sVar2 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::size
                      (&this->_sensorTypes);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::TwoByteChunk,_std::allocator<DIS::TwoByteChunk>_>::operator[]
                       (&this->_sensorTypes,x._8_8_);
    TwoByteChunk::TwoByteChunk((TwoByteChunk *)local_30,pvVar3);
    TwoByteChunk::marshal((TwoByteChunk *)local_30,dataStream);
    TwoByteChunk::~TwoByteChunk((TwoByteChunk *)local_30);
    x._8_8_ = x._8_8_ + 1;
  }
  DataStream::operator<<(dataStream,this->_pad3);
  x_1._z = 0.0;
  x_1._20_4_ = 0;
  while( true ) {
    uVar1 = x_1._16_8_;
    sVar2 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::size
                      (&this->_mineLocation);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar4 = std::vector<DIS::Vector3Float,_std::allocator<DIS::Vector3Float>_>::operator[]
                       (&this->_mineLocation,x_1._16_8_);
    Vector3Float::Vector3Float((Vector3Float *)local_60,pvVar4);
    Vector3Float::marshal((Vector3Float *)local_60,dataStream);
    Vector3Float::~Vector3Float((Vector3Float *)local_60);
    x_1._16_8_ = x_1._16_8_ + 1;
  }
  return;
}

Assistant:

void MinefieldDataPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _minefieldSequenceNumbeer;
    dataStream << _requestID;
    dataStream << _pduSequenceNumber;
    dataStream << _numberOfPdus;
    dataStream << ( unsigned char )_mineLocation.size();
    dataStream << ( unsigned char )_sensorTypes.size();
    dataStream << _pad2;
    dataStream << _dataFilter;
    _mineType.marshal(dataStream);

     for(size_t idx = 0; idx < _sensorTypes.size(); idx++)
     {
        TwoByteChunk x = _sensorTypes[idx];
        x.marshal(dataStream);
     }

    dataStream << _pad3;

     for(size_t idx = 0; idx < _mineLocation.size(); idx++)
     {
        Vector3Float x = _mineLocation[idx];
        x.marshal(dataStream);
     }

}